

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
ConfigurationTestNode::Evaluate
          (string *__return_storage_ptr__,ConfigurationTestNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *desired_config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  char *pcVar11;
  string mapProp;
  string suffix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  char *imp;
  char *loc;
  string local_d8;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  char *local_40;
  char *local_38;
  
  if ((parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    context->HadContextSensitiveCondition = true;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (context->Config)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (context->Config)._M_string_length);
  }
  else {
    if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
         ::configValidator == '\0') &&
       (iVar7 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                     ::configValidator), iVar7 != 0)) {
      Evaluate::configValidator.program = (char *)0x0;
      cmsys::RegularExpression::compile(&Evaluate::configValidator,"^[A-Za-z0-9_]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::configValidator,
                   &__dso_handle);
      __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                           ::configValidator);
    }
    bVar5 = cmsys::RegularExpression::find
                      (&Evaluate::configValidator,
                       (((parameters->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if (bVar5) {
      context->HadContextSensitiveCondition = true;
      pbVar2 = (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((context->Config)._M_string_length == 0) {
        bVar5 = pbVar2->_M_string_length == 0;
        pcVar8 = "0";
        if (bVar5) {
          pcVar8 = "1";
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "";
        if (bVar5) {
          pcVar11 = "";
        }
      }
      else {
        desired_config = &context->Config;
        iVar7 = cmsysString_strcasecmp
                          ((pbVar2->_M_dataplus)._M_p,(desired_config->_M_dataplus)._M_p);
        if (iVar7 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "1";
          pcVar11 = "";
        }
        else {
          if ((context->CurrentTarget != (cmGeneratorTarget *)0x0) &&
             (bVar5 = cmGeneratorTarget::IsImported(context->CurrentTarget), bVar5)) {
            local_38 = (char *)0x0;
            local_40 = (char *)0x0;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            local_98._M_string_length = 0;
            local_98.field_2._M_local_buf[0] = '\0';
            bVar6 = cmTarget::GetMappedConfig
                              (context->CurrentTarget->Target,desired_config,&local_38,&local_40,
                               &local_98);
            bVar5 = true;
            if (bVar6) {
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,"MAP_IMPORTED_CONFIG_","");
              cmsys::SystemTools::UpperCase(&local_b8,desired_config);
              std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
              paVar1 = &local_b8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar1) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              pcVar8 = cmGeneratorTarget::GetProperty(context->CurrentTarget,&local_d8);
              if (pcVar8 == (char *)0x0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_78);
              }
              else {
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                sVar9 = strlen(pcVar8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,pcVar8,pcVar8 + sVar9);
                cmsys::SystemTools::UpperCase(&local_b8,&local_60);
                cmSystemTools::ExpandListArgument(&local_b8,&local_78,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p,
                                  local_60.field_2._M_allocated_capacity + 1);
                }
                pbVar4 = local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar2 = local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                cmsys::SystemTools::UpperCase
                          (&local_b8,
                           (parameters->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
                _Var10 = std::
                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   (pbVar2,pbVar4,&local_b8);
                pcVar8 = "1";
                if (_Var10._M_current ==
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  pcVar8 = "0";
                }
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                pcVar11 = "";
                if (_Var10._M_current ==
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  pcVar11 = "";
                }
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__return_storage_ptr__,pcVar8,pcVar11);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_78);
                bVar5 = false;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,
                              CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                       local_98.field_2._M_local_buf[0]) + 1);
            }
            if (!bVar5) {
              return __return_storage_ptr__;
            }
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "0";
          pcVar11 = "";
        }
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar8,pcVar11);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Expression syntax not recognized.","");
      reportError(context,&local_98,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    if (parameters.empty()) {
      return configurationNode.Evaluate(parameters, context, content,
                                        CM_NULLPTR);
    }
    static cmsys::RegularExpression configValidator("^[A-Za-z0-9_]*$");
    if (!configValidator.find(*parameters.begin())) {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
    }
    context->HadContextSensitiveCondition = true;
    if (context->Config.empty()) {
      return parameters.front().empty() ? "1" : "0";
    }

    if (cmsysString_strcasecmp(parameters.begin()->c_str(),
                               context->Config.c_str()) == 0) {
      return "1";
    }

    if (context->CurrentTarget && context->CurrentTarget->IsImported()) {
      const char* loc = CM_NULLPTR;
      const char* imp = CM_NULLPTR;
      std::string suffix;
      if (context->CurrentTarget->Target->GetMappedConfig(
            context->Config, &loc, &imp, suffix)) {
        // This imported target has an appropriate location
        // for this (possibly mapped) config.
        // Check if there is a proper config mapping for the tested config.
        std::vector<std::string> mappedConfigs;
        std::string mapProp = "MAP_IMPORTED_CONFIG_";
        mapProp += cmSystemTools::UpperCase(context->Config);
        if (const char* mapValue =
              context->CurrentTarget->GetProperty(mapProp)) {
          cmSystemTools::ExpandListArgument(cmSystemTools::UpperCase(mapValue),
                                            mappedConfigs);
          return std::find(mappedConfigs.begin(), mappedConfigs.end(),
                           cmSystemTools::UpperCase(parameters.front())) !=
              mappedConfigs.end()
            ? "1"
            : "0";
        }
      }
    }
    return "0";
  }